

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawArc
          (cbtIDebugDraw *this,cbtVector3 *center,cbtVector3 *normal,cbtVector3 *axis,
          cbtScalar radiusA,cbtScalar radiusB,cbtScalar minAngle,cbtScalar maxAngle,
          cbtVector3 *color,bool drawSect,cbtScalar stepDegrees)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  undefined3 in_register_00000089;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  cbtVector3 prev;
  cbtVector3 next;
  undefined1 local_58 [16];
  undefined1 local_40 [16];
  
  fVar2 = axis->m_floats[2];
  fVar3 = axis->m_floats[0];
  fVar4 = axis->m_floats[1];
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * normal->m_floats[2])),
                            ZEXT416((uint)normal->m_floats[1]),ZEXT416((uint)fVar2));
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * normal->m_floats[0])),ZEXT416((uint)fVar3),
                            ZEXT416((uint)normal->m_floats[2]));
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx512vl(ZEXT416((uint)((maxAngle - minAngle) / (stepDegrees * 0.017453292))),
                            auVar13);
  auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * normal->m_floats[1])),ZEXT416((uint)fVar4),
                            ZEXT416((uint)normal->m_floats[0]));
  iVar15 = (int)auVar16._0_4_ + (uint)((int)auVar16._0_4_ == 0);
  fVar17 = cosf(minAngle);
  fVar5 = center->m_floats[0];
  fVar6 = center->m_floats[1];
  fVar7 = center->m_floats[2];
  fVar8 = radiusB * auVar11._0_4_;
  fVar9 = radiusB * auVar12._0_4_;
  fVar10 = radiusB * auVar13._0_4_;
  fVar18 = sinf(minAngle);
  auVar11 = vinsertps_avx(ZEXT416((uint)(fVar18 * fVar8 + fVar17 * fVar3 * radiusA + fVar5)),
                          ZEXT416((uint)(fVar18 * fVar9 + fVar17 * fVar4 * radiusA + fVar6)),0x10);
  local_58 = vinsertps_avx(auVar11,ZEXT416((uint)(fVar18 * fVar10 + fVar17 * fVar2 * radiusA + fVar7
                                                 )),0x28);
  if (CONCAT31(in_register_00000089,drawSect) != 0) {
    (*this->_vptr_cbtIDebugDraw[4])(this,center,local_58,color);
  }
  if (0 < iVar15) {
    iVar14 = 1;
    do {
      fVar17 = ((maxAngle - minAngle) * (float)iVar14) / (float)iVar15 + minAngle;
      fVar2 = axis->m_floats[0];
      fVar3 = axis->m_floats[1];
      fVar4 = axis->m_floats[2];
      fVar18 = cosf(fVar17);
      fVar5 = center->m_floats[0];
      fVar6 = center->m_floats[1];
      fVar7 = center->m_floats[2];
      fVar17 = sinf(fVar17);
      auVar11 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar8 + fVar18 * radiusA * fVar2 + fVar5)),
                              ZEXT416((uint)(fVar17 * fVar9 + fVar18 * radiusA * fVar3 + fVar6)),
                              0x10);
      local_40 = vinsertps_avx(auVar11,ZEXT416((uint)(fVar17 * fVar10 +
                                                     fVar18 * radiusA * fVar4 + fVar7)),0x28);
      (*this->_vptr_cbtIDebugDraw[4])(this,local_58,local_40,color);
      local_58 = local_40;
      iVar1 = (1 - iVar15) + iVar14;
      iVar14 = iVar14 + 1;
    } while (iVar1 != 1);
  }
  if (drawSect) {
    (*this->_vptr_cbtIDebugDraw[4])(this,center,local_58,color);
  }
  return;
}

Assistant:

virtual void drawArc(const cbtVector3& center, const cbtVector3& normal, const cbtVector3& axis, cbtScalar radiusA, cbtScalar radiusB, cbtScalar minAngle, cbtScalar maxAngle,
						 const cbtVector3& color, bool drawSect, cbtScalar stepDegrees = cbtScalar(10.f))
	{
		const cbtVector3& vx = axis;
		cbtVector3 vy = normal.cross(axis);
		cbtScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		int nSteps = (int)cbtFabs((maxAngle - minAngle) / step);
		if (!nSteps) nSteps = 1;
		cbtVector3 prev = center + radiusA * vx * cbtCos(minAngle) + radiusB * vy * cbtSin(minAngle);
		if (drawSect)
		{
			drawLine(center, prev, color);
		}
		for (int i = 1; i <= nSteps; i++)
		{
			cbtScalar angle = minAngle + (maxAngle - minAngle) * cbtScalar(i) / cbtScalar(nSteps);
			cbtVector3 next = center + radiusA * vx * cbtCos(angle) + radiusB * vy * cbtSin(angle);
			drawLine(prev, next, color);
			prev = next;
		}
		if (drawSect)
		{
			drawLine(center, prev, color);
		}
	}